

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

optional<AddressPosition> * __thiscall
AddrManImpl::FindAddressEntry_
          (optional<AddressPosition> *__return_storage_ptr__,AddrManImpl *this,CAddress *addr)

{
  long lVar1;
  int bucket;
  int iVar2;
  AddrInfo *this_00;
  int iVar3;
  uint256 *nKey;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  this_00 = Find(this,&addr->super_CService,(int *)0x0);
  if (this_00 != (AddrInfo *)0x0) {
    nKey = &this->nKey;
    bVar4 = this_00->fInTried != true;
    if (bVar4) {
      bucket = AddrInfo::GetNewBucket(this_00,nKey,&this_00->source,this->m_netgroupman);
      iVar3 = this_00->nRefCount;
      iVar2 = AddrInfo::GetBucketPosition(this_00,nKey,true,bucket);
    }
    else {
      bucket = AddrInfo::GetTriedBucket(this_00,nKey,this->m_netgroupman);
      iVar2 = AddrInfo::GetBucketPosition(this_00,nKey,false,bucket);
      iVar3 = 1;
    }
    (__return_storage_ptr__->super__Optional_base<AddressPosition,_true,_true>)._M_payload.
    super__Optional_payload_base<AddressPosition>._M_payload._M_value.tried = !bVar4;
    (__return_storage_ptr__->super__Optional_base<AddressPosition,_true,_true>)._M_payload.
    super__Optional_payload_base<AddressPosition>._M_payload._M_value.multiplicity = iVar3;
    (__return_storage_ptr__->super__Optional_base<AddressPosition,_true,_true>)._M_payload.
    super__Optional_payload_base<AddressPosition>._M_payload._M_value.bucket = bucket;
    (__return_storage_ptr__->super__Optional_base<AddressPosition,_true,_true>)._M_payload.
    super__Optional_payload_base<AddressPosition>._M_payload._M_value.position = iVar2;
    bVar4 = true;
  }
  (__return_storage_ptr__->super__Optional_base<AddressPosition,_true,_true>)._M_payload.
  super__Optional_payload_base<AddressPosition>._M_engaged = bVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<AddressPosition> AddrManImpl::FindAddressEntry_(const CAddress& addr)
{
    AssertLockHeld(cs);

    AddrInfo* addr_info = Find(addr);

    if (!addr_info) return std::nullopt;

    if(addr_info->fInTried) {
        int bucket{addr_info->GetTriedBucket(nKey, m_netgroupman)};
        return AddressPosition(/*tried_in=*/true,
                               /*multiplicity_in=*/1,
                               /*bucket_in=*/bucket,
                               /*position_in=*/addr_info->GetBucketPosition(nKey, false, bucket));
    } else {
        int bucket{addr_info->GetNewBucket(nKey, m_netgroupman)};
        return AddressPosition(/*tried_in=*/false,
                               /*multiplicity_in=*/addr_info->nRefCount,
                               /*bucket_in=*/bucket,
                               /*position_in=*/addr_info->GetBucketPosition(nKey, true, bucket));
    }
}